

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

string * __thiscall
tchecker::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tchecker *this,sync_id_t sync_id,system_t *system)

{
  synchronization_t *constraints;
  string *psVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  it;
  pointer psVar3;
  synchronization_t sync;
  stringstream ss;
  synchronization_t local_210;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  constraints = tchecker::system::synchronizations_t::synchronization
                          ((synchronizations_t *)(CONCAT44(in_register_00000014,sync_id) + 0x2d8),
                           (sync_id_t)this);
  tchecker::system::synchronization_t::synchronization_t(&local_210,constraints);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"<");
  for (psVar3 = local_210._constraints.
                super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar3 != local_210._constraints.
                super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
    if (psVar3 != local_210._constraints.
                  super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(local_1a8,",");
    }
    psVar1 = tchecker::system::processes_t::process_name_abi_cxx11_
                       ((processes_t *)(CONCAT44(in_register_00000014,sync_id) + 0x290),psVar3->_pid
                       );
    poVar2 = std::operator<<(local_1a8,(string *)psVar1);
    poVar2 = std::operator<<(poVar2,"@");
    psVar1 = tchecker::system::events_t::event_name_abi_cxx11_
                       ((events_t *)(CONCAT44(in_register_00000014,sync_id) + 0x130),
                        psVar3->_event_id);
    std::operator<<(poVar2,(string *)psVar1);
    if (psVar3->_strength == SYNC_WEAK) {
      std::operator<<(local_1a8,"?");
    }
  }
  std::operator<<(local_1a8,">");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  tchecker::system::synchronization_t::~synchronization_t(&local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tchecker::sync_id_t sync_id, tchecker::system::system_t const & system)
{
  tchecker::system::synchronization_t sync = system.synchronization(sync_id);

  std::stringstream ss;
  ss << "<";
  auto r = sync.synchronization_constraints();
  for (auto it = r.begin(); it != r.end(); ++it) {
    if (it != r.begin())
      ss << ",";
    tchecker::system::sync_constraint_t const & constr = *it;
    ss << system.process_name(constr.pid()) << "@" << system.event_name(constr.event_id());
    if (constr.strength() == tchecker::SYNC_WEAK)
      ss << "?";
  }
  ss << ">";
  return ss.str();
}